

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  allocator local_1f2;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  gulcalcopts local_1b0;
  string local_108;
  string local_e8;
  sigaction sa;
  
  local_1b0.rndopt = usehashedseed;
  local_1b0.rand_vector_size = 1000000;
  local_1b0.rand_seed = 0;
  local_1b0.item_output._M_dataplus._M_p = (pointer)&local_1b0.item_output.field_2;
  local_1b0.item_output._M_string_length = 0;
  local_1b0.item_output.field_2._M_local_buf[0] = '\0';
  local_1b0.coverage_output._M_dataplus._M_p = (pointer)&local_1b0.coverage_output.field_2;
  local_1b0.coverage_output._M_string_length = 0;
  local_1b0.coverage_output.field_2._M_local_buf[0] = '\0';
  local_1b0.correlated_output._M_dataplus._M_p = (pointer)&local_1b0.correlated_output.field_2;
  local_1b0.correlated_output._M_string_length = 0;
  local_1b0.correlated_output.field_2._M_local_buf[0] = '\0';
  local_1b0.itemLevelOutput = false;
  local_1b0.coverageLevelOutput = false;
  local_1b0.correlatedLevelOutput = false;
  local_1b0.samplesize = -1;
  local_1b0.debug = false;
  local_1b0.itemout = (FILE *)_stdout;
  local_1b0.covout = (FILE *)_stdout;
  local_1b0.corrout = (FILE *)_stdout;
  local_1b0.allocRule = -1;
  local_1b0.benchmark = false;
  local_1b0.loss_threshold = 1e-06;
  progname = *argv;
  do {
    iVar2 = getopt(argc,argv,"Alvhdrba:L:S:c:i:j:R:s:");
    switch(iVar2) {
    case 0x61:
      local_1b0.allocRule = atoi(_optarg);
      break;
    case 0x62:
      local_1b0.benchmark = true;
      break;
    case 99:
      std::__cxx11::string::assign((char *)&local_1b0.coverage_output);
      local_1b0.coverageLevelOutput = true;
      break;
    case 100:
      local_1b0.debug = true;
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x74:
    case 0x75:
switchD_00106c90_caseD_65:
      help();
LAB_0010705b:
      exit(1);
    case 0x69:
      std::__cxx11::string::assign((char *)&local_1b0.item_output);
      local_1b0.itemLevelOutput = true;
      break;
    case 0x6a:
      std::__cxx11::string::assign((char *)&local_1b0.correlated_output);
      local_1b0.correlatedLevelOutput = true;
      break;
    case 0x6c:
      local_1b0.rndopt = usecachedvector;
      break;
    case 0x72:
      local_1b0.rndopt = userandomnumberfile;
      break;
    case 0x73:
      local_1b0.rand_seed = atoi(_optarg);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_0010705b;
    default:
      if (iVar2 == 0x41) {
        local_1b0.rndopt = usehashedseed;
      }
      else if (iVar2 == 0x4c) {
        local_1b0.loss_threshold = atof(_optarg);
      }
      else if (iVar2 == 0x52) {
        local_1b0.rand_vector_size = atoi(_optarg);
      }
      else {
        if (iVar2 != 0x53) {
          if (iVar2 == -1) {
            memset(&sa,0,0x98);
            sigemptyset((sigset_t *)&sa.sa_mask);
            sa.__sigaction_handler.sa_handler = segfault_sigaction;
            sa.sa_flags = 4;
            sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
            pFVar3 = (FILE *)local_1b0.itemout;
            if ((local_1b0.itemLevelOutput == true) &&
               (bVar1 = std::operator==(&local_1b0.item_output,"-"), pFVar3 = _stdout, !bVar1)) {
              pFVar3 = fopen(local_1b0.item_output._M_dataplus._M_p,"wb");
            }
            local_1b0.itemout = (FILE *)pFVar3;
            pFVar3 = (FILE *)local_1b0.covout;
            if (local_1b0.coverageLevelOutput == true) {
              if (local_1b0.allocRule < 1) {
                bVar1 = std::operator==(&local_1b0.coverage_output,"-");
                pFVar3 = _stdout;
                if (!bVar1) {
                  pFVar3 = fopen(local_1b0.coverage_output._M_dataplus._M_p,"wb");
                }
              }
              else {
                fprintf(_stderr,
                        "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n"
                       );
                local_1b0.coverageLevelOutput = false;
                pFVar3 = (FILE *)local_1b0.covout;
              }
            }
            local_1b0.covout = (FILE *)pFVar3;
            if ((local_1b0.correlatedLevelOutput == true) &&
               (local_1b0.corrout = (FILE *)fopen(local_1b0.correlated_output._M_dataplus._M_p,"wb")
               , (FILE *)local_1b0.corrout == (FILE *)0x0)) {
              fwrite("FATAL: Correlated output file name must be specified\n",0x35,1,_stderr);
            }
            else if (local_1b0.coverageLevelOutput == false && local_1b0.itemLevelOutput == false) {
              fprintf(_stderr,"FATAL: S%s: No output option selected\n",*argv);
            }
            else {
              if (local_1b0.allocRule < 4) {
                std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_1d0);
                std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_1f0);
                initstreams(&local_e8,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::string((string *)&local_1d0,progname,&local_1f1);
                std::__cxx11::string::string((string *)&local_1f0,"INFO",&local_1f2);
                logprintf(&local_1d0,&local_1f0,"starting process..\n");
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&local_1d0);
                doit(&local_1b0);
                std::__cxx11::string::string((string *)&local_1d0,progname,&local_1f1);
                std::__cxx11::string::string((string *)&local_1f0,"INFO",&local_1f2);
                logprintf(&local_1d0,&local_1f0,"finishing process..\n");
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&local_1d0);
                gulcalcopts::~gulcalcopts(&local_1b0);
                return 0;
              }
              fprintf(_stderr,"FATAL: Invalid alloc rule %d\n");
            }
            goto LAB_0010705b;
          }
          goto switchD_00106c90_caseD_65;
        }
        local_1b0.samplesize = atoi(_optarg);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	gulcalcopts gopt;
	gopt.loss_threshold = 0.000001;
	progname = argv[0];
	while ((opt = getopt(argc, argv, "Alvhdrba:L:S:c:i:j:R:s:")) != -1) {
		switch (opt) {
		case 'S':
			gopt.samplesize = atoi(optarg);
			break;
		case 'l':
			gopt.rndopt = rd_option::usecachedvector;
			break;
		case 'A':
			gopt.rndopt = rd_option::usehashedseed;
			break;
		case 'a':
			gopt.allocRule = atoi(optarg);
			break;
		case 'b':
			gopt.benchmark = true;
			break;
		case 'r':
			gopt.rndopt = rd_option::userandomnumberfile;
			break;
		case 'L':
			gopt.loss_threshold = atof(optarg);
			break;
		case 'R':
			gopt.rand_vector_size = atoi(optarg);
			break;
		case 'i':
			gopt.item_output = optarg;
			gopt.itemLevelOutput = true;
			break;
		case 'j':
			gopt.correlated_output = optarg;
			gopt.correlatedLevelOutput = true;
			break;
		case 'c':
			gopt.coverage_output = optarg;
			gopt.coverageLevelOutput = true;
			break;
		case 'd':
			gopt.debug = true;
			break;		
		case 's':
			gopt.rand_seed = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default: /* '?' */
			help();
			exit(EXIT_FAILURE);
		}
	}

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (gopt.itemLevelOutput == true) {
		if (gopt.item_output == "-") gopt.itemout = stdout;
		else gopt.itemout = fopen(gopt.item_output.c_str(), "wb");
	}
	if (gopt.coverageLevelOutput == true) {
		if (gopt.allocRule <= 0) {
			if (gopt.coverage_output == "-") gopt.covout = stdout;
			else gopt.covout = fopen(gopt.coverage_output.c_str(), "wb");
		} else {
			fprintf(stderr, "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n", gopt.allocRule);
			gopt.coverageLevelOutput = false;
		}
	}
	if(gopt.correlatedLevelOutput == true) {
		gopt.corrout = fopen(gopt.correlated_output.c_str(), "wb");
		if(gopt.corrout == NULL) {
			fprintf(stderr, "FATAL: Correlated output file name must be specified\n");
			exit(EXIT_FAILURE);
		}
	}

	if (gopt.itemLevelOutput == false && gopt.coverageLevelOutput == false) {
		fprintf(stderr, "FATAL: S%s: No output option selected\n", argv[0]);
		exit(EXIT_FAILURE);
	}

	if (gopt.allocRule > 3) {
		fprintf(stderr, "FATAL: Invalid alloc rule %d\n", gopt.allocRule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams();
		logprintf(progname, "INFO", "starting process..\n");
		doit(gopt);
		logprintf(progname, "INFO", "finishing process..\n");
	}catch (std::bad_alloc&) {
			fprintf(stderr, "FATAL:%s: Memory allocation failed\n", progname);
			exit(EXIT_FAILURE);
	}

}